

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O0

int usedp(sexp lambda,sexp var,sexp x)

{
  int iVar1;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  bool bVar2;
  sexp ls;
  bool local_39;
  sexp_tag_t local_2c;
  sexp in_stack_ffffffffffffffd8;
  sexp var_00;
  
  do {
    if (((ulong)in_RDX & 3) == 0) {
      local_2c = in_RDX->tag;
    }
    else {
      local_2c = 0;
    }
    switch(local_2c) {
    case 0x1c:
      in_RDX = (in_RDX->value).type.slots;
      break;
    case 0x1d:
      iVar1 = usedp(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      if ((iVar1 != 0) || (iVar1 = usedp(in_RSI,in_RDX,in_stack_ffffffffffffffd8), iVar1 != 0)) {
        return 1;
      }
      in_RDX = (in_RDX->value).type.slots;
      break;
    case 0x1e:
      local_39 = false;
      if ((in_RDX->value).type.name == in_RSI) {
        local_39 = (((in_RDX->value).type.cpl)->value).type.cpl == in_RDI;
      }
      return (uint)local_39;
    case 0x1f:
      in_RDX = (in_RDX->value).type.cpl;
      break;
    case 0x21:
      in_RDX = (in_RDX->value).type.name;
    case 6:
      var_00 = in_RDX;
      while( true ) {
        bVar2 = false;
        if (((ulong)in_RDX & 3) == 0) {
          bVar2 = in_RDX->tag == 6;
        }
        if (!bVar2) break;
        iVar1 = usedp(in_RSI,var_00,in_RDX);
        if (iVar1 != 0) {
          return 1;
        }
        in_RDX = (in_RDX->value).type.cpl;
      }
    default:
      return 0;
    }
  } while( true );
}

Assistant:

static int usedp (sexp lambda, sexp var, sexp x) {
  sexp ls;
 loop:
  switch (sexp_pointerp(x) ? sexp_pointer_tag(x) : 0) {
  case SEXP_REF:
    return sexp_ref_name(x) == var && sexp_ref_loc(x) == lambda;
  case SEXP_SET:
    x = sexp_set_value(x);
    goto loop;
  case SEXP_LAMBDA:
    x = sexp_lambda_body(x);
    goto loop;
  case SEXP_CND:
    if (usedp(lambda, var, sexp_cnd_test(x))
        || usedp(lambda, var, sexp_cnd_pass(x)))
      return 1;
    x = sexp_cnd_fail(x);
    goto loop;
  case SEXP_SEQ:
    x = sexp_seq_ls(x);
  case SEXP_PAIR:
    for (ls=x; sexp_pairp(ls); ls=sexp_cdr(ls))
      if (usedp(lambda, var, sexp_car(ls)))
        return 1;
  }
  return 0;
}